

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  uint in_EAX;
  int iVar1;
  Fib *this;
  long *plVar2;
  int n;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  this = (Fib *)operator_new(1);
  uStack_18 = (ulong)(uint)uStack_18;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_18 + 4));
  iVar1 = Fib::calculate(this,uStack_18._4_4_);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  operator_delete(this);
  return 0;
}

Assistant:

int main()
{
  Fib * fib = new Fib();
  int n = 0;
  std::cin >> n;
  int result = fib->calculate(n);
  std::cout << result << std::endl;
  delete(fib);
}